

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_quaternion rf_quaternion_mul(rf_quaternion q1,rf_quaternion q2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float qax;
  rf_quaternion rVar9;
  
  fVar3 = q1.z;
  fVar4 = q1.w;
  fVar1 = q1.x;
  fVar2 = q1.y;
  fVar5 = q2.x;
  fVar6 = q2.y;
  fVar7 = q2.z;
  fVar8 = q2.w;
  rVar9.y = (fVar3 * fVar5 + fVar2 * fVar8 + fVar4 * fVar6) - fVar1 * fVar7;
  rVar9.x = (fVar2 * fVar7 + fVar1 * fVar8 + fVar4 * fVar5) - fVar3 * fVar6;
  rVar9.w = ((fVar8 * fVar4 - fVar5 * fVar1) - fVar6 * fVar2) - fVar3 * fVar7;
  rVar9.z = (fVar1 * fVar6 + fVar3 * fVar8 + fVar4 * fVar7) - fVar2 * fVar5;
  return rVar9;
}

Assistant:

RF_API rf_quaternion rf_quaternion_mul(rf_quaternion q1, rf_quaternion q2)
{
    rf_quaternion result = {0};

    float qax = q1.x, qay = q1.y, qaz = q1.z, qaw = q1.w;
    float qbx = q2.x, qby = q2.y, qbz = q2.z, qbw = q2.w;

    result.x = qax * qbw + qaw * qbx + qay * qbz - qaz * qby;
    result.y = qay * qbw + qaw * qby + qaz * qbx - qax * qbz;
    result.z = qaz * qbw + qaw * qbz + qax * qby - qay * qbx;
    result.w = qaw * qbw - qax * qbx - qay * qby - qaz * qbz;

    return result;
}